

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# implementation.hpp
# Opt level: O2

void __thiscall
boost::unordered::detail::
table<boost::unordered::detail::map<std::allocator<std::pair<const_int,_boost::tuples::tuple<bool,_unsigned_int,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type>_>_>,_int,_boost::tuples::tuple<bool,_unsigned_int,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type>,_boost::hash<int>,_std::equal_to<int>_>_>
::rehash_impl(table<boost::unordered::detail::map<std::allocator<std::pair<const_int,_boost::tuples::tuple<bool,_unsigned_int,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type>_>_>,_int,_boost::tuples::tuple<bool,_unsigned_int,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type>,_boost::hash<int>,_std::equal_to<int>_>_>
              *this,size_t num_buckets)

{
  link_pointer ppVar1;
  link_pointer pbVar2;
  bucket_pointer ppVar3;
  ulong bucket_index;
  link_pointer ppVar4;
  
  if (this->buckets_ != (bucket_pointer)0x0) {
    create_buckets(this,num_buckets);
    pbVar2 = get_previous_start(this);
    while (ppVar4 = pbVar2->next_, ppVar4 != (link_pointer)0x0) {
      bucket_index = (ulong)(long)*(int *)&ppVar4[2].next_ % this->bucket_count_;
      ppVar4[1].next_ = (link_pointer)(bucket_index & 0x7fffffffffffffff);
      while ((ppVar1 = ppVar4->next_, ppVar1 != (link_pointer)0x0 && ((long)ppVar1[1].next_ < 0))) {
        ppVar1[1].next_ = (link_pointer)(bucket_index | 0x8000000000000000);
        ppVar4 = ppVar1;
      }
      ppVar3 = get_bucket(this,bucket_index);
      if (ppVar3->next_ == (link_pointer)0x0) {
        ppVar3->next_ = pbVar2;
        pbVar2 = ppVar4;
      }
      else {
        ppVar1 = ppVar4->next_;
        ppVar4->next_ = ppVar3->next_->next_;
        ppVar3->next_->next_ = pbVar2->next_;
        pbVar2->next_ = ppVar1;
      }
    }
    return;
  }
  __assert_fail("this->buckets_",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Sleeplessy[P]ccel/third_party/boost/boost/unordered/detail/implementation.hpp"
                ,0x1156,
                "void boost::unordered::detail::table<boost::unordered::detail::map<std::allocator<std::pair<const int, boost::tuples::tuple<bool, unsigned int>>>, int, boost::tuples::tuple<bool, unsigned int>, boost::hash<int>, std::equal_to<int>>>::rehash_impl(std::size_t) [Types = boost::unordered::detail::map<std::allocator<std::pair<const int, boost::tuples::tuple<bool, unsigned int>>>, int, boost::tuples::tuple<bool, unsigned int>, boost::hash<int>, std::equal_to<int>>]"
               );
}

Assistant:

inline void table<Types>::rehash_impl(std::size_t num_buckets)
      {
        BOOST_ASSERT(this->buckets_);

        this->create_buckets(num_buckets);
        link_pointer prev = this->get_previous_start();
        BOOST_TRY
        {
          while (prev->next_) {
            node_pointer n = next_node(prev);
            std::size_t key_hash = this->hash(this->get_key(n));
            std::size_t bucket_index = this->hash_to_bucket(key_hash);

            n->bucket_info_ = bucket_index;
            n->set_first_in_group();

            // Iterator through the rest of the group of equal nodes,
            // setting the bucket.
            for (;;) {
              node_pointer next = next_node(n);
              if (!next || next->is_first_in_group()) {
                break;
              }
              n = next;
              n->bucket_info_ = bucket_index;
              n->reset_first_in_group();
            }

            // n is now the last node in the group
            bucket_pointer b = this->get_bucket(bucket_index);
            if (!b->next_) {
              b->next_ = prev;
              prev = n;
            } else {
              link_pointer next = n->next_;
              n->next_ = b->next_->next_;
              b->next_->next_ = prev->next_;
              prev->next_ = next;
            }
          }
        }
        BOOST_CATCH(...)
        {
          node_pointer n = next_node(prev);
          prev->next_ = node_pointer();
          while (n) {
            node_pointer next = next_node(n);
            destroy_node(n);
            --size_;
            n = next;
          }
          BOOST_RETHROW
        }
        BOOST_CATCH_END
      }

#if defined(BOOST_MSVC)
#pragma warning(pop)
#endif

      ////////////////////////////////////////////////////////////////////////
      // key extractors
      //
      // no throw
      //
      // 'extract_key' is called with the emplace parameters to return a
      // key if available or 'no_key' is one isn't and will need to be
      // constructed. This could be done by overloading the emplace
      // implementation
      // for the different cases, but that's a bit tricky on compilers without
      // variadic templates.

      template <typename Key, typename T> struct is_key
      {
        template <typename T2> static choice1::type test(T2 const&);
        static choice2::type test(Key const&);

        enum
        {
          value = sizeof(test(boost::unordered::detail::make<T>())) ==
                  sizeof(choice2::type)
        };

        typedef typename boost::detail::if_true<value>::BOOST_NESTED_TEMPLATE
          then<Key const&, no_key>::type type;
      };

      template <class ValueType> struct set_extractor
      {
        typedef ValueType value_type;
        typedef ValueType key_type;

        static key_type const& extract(value_type const& v) { return v; }

        static key_type const& extract(BOOST_UNORDERED_RV_REF(value_type) v)
        {
          return v;
        }

        static no_key extract() { return no_key(); }

        template <class Arg> static no_key extract(Arg const&)
        {
          return no_key();
        }

#if !defined(BOOST_NO_CXX11_VARIADIC_TEMPLATES)
        template <class Arg1, class Arg2, class... Args>
        static no_key extract(Arg1 const&, Arg2 const&, Args const&...)
        {
          return no_key();
        }
#else
        template <class Arg1, class Arg2>
        static no_key extract(Arg1 const&, Arg2 const&)
        {
          return no_key();
        }
#endif
      };

      template <class ValueType> struct map_extractor
      {
        typedef ValueType value_type;
        typedef typename boost::remove_const<typename boost::unordered::detail::
            pair_traits<ValueType>::first_type>::type key_type;

        static key_type const& extract(value_type const& v) { return v.first; }

        template <class Second>
        static key_type const& extract(std::pair<key_type, Second> const& v)
        {
          return v.first;
        }

        template <class Second>
        static key_type const& extract(
          std::pair<key_type const, Second> const& v)
        {
          return v.first;
        }

#if defined(BOOST_NO_CXX11_RVALUE_REFERENCES)
        template <class Second>
        static key_type const& extract(
          boost::rv<std::pair<key_type, Second> > const& v)
        {
          return v.first;
        }

        template <class Second>
        static key_type const& extract(
          boost::rv<std::pair<key_type const, Second> > const& v)
        {
          return v.first;
        }
#endif

        template <class Arg1>
        static key_type const& extract(key_type const& k, Arg1 const&)
        {
          return k;
        }

        static no_key extract() { return no_key(); }

        template <class Arg> static no_key extract(Arg const&)
        {
          return no_key();
        }

        template <class Arg1, class Arg2>
        static no_key extract(Arg1 const&, Arg2 const&)
        {
          return no_key();
        }

#if !defined(BOOST_NO_CXX11_VARIADIC_TEMPLATES)
        template <class Arg1, class Arg2, class Arg3, class... Args>
        static no_key extract(
          Arg1 const&, Arg2 const&, Arg3 const&, Args const&...)
        {
          return no_key();
        }
#endif

#if !defined(BOOST_NO_CXX11_VARIADIC_TEMPLATES)

#define BOOST_UNORDERED_KEY_FROM_TUPLE(namespace_)                             \
  template <typename T2>                                                       \
  static no_key extract(boost::unordered::piecewise_construct_t,               \
    namespace_ tuple<> const&, T2 const&)                                      \
  {                                                                            \
    return no_key();                                                           \
  }                                                                            \
                                                                               \
  template <typename T, typename T2>                                           \
  static typename is_key<key_type, T>::type extract(                           \
    boost::unordered::piecewise_construct_t, namespace_ tuple<T> const& k,     \
    T2 const&)                                                                 \
  {                                                                            \
    return typename is_key<key_type, T>::type(namespace_ get<0>(k));           \
  }

#else

#define BOOST_UNORDERED_KEY_FROM_TUPLE(namespace_)                             \
  static no_key extract(                                                       \
    boost::unordered::piecewise_construct_t, namespace_ tuple<> const&)        \
  {                                                                            \
    return no_key();                                                           \
  }                                                                            \
                                                                               \
  template <typename T>                                                        \
  static typename is_key<key_type, T>::type extract(                           \
    boost::unordered::piecewise_construct_t, namespace_ tuple<T> const& k)     \
  {                                                                            \
    return typename is_key<key_type, T>::type(namespace_ get<0>(k));           \
  }

#endif

        BOOST_UNORDERED_KEY_FROM_TUPLE(boost::)

#if BOOST_UNORDERED_TUPLE_ARGS
        BOOST_UNORDERED_KEY_FROM_TUPLE(std::)
#endif

#undef BOOST_UNORDERED_KEY_FROM_TUPLE
      };

      ////////////////////////////////////////////////////////////////////////
      // Unique nodes

      template <typename A, typename T>
      struct node : boost::unordered::detail::value_base<T>
      {
        typedef
          typename ::boost::unordered::detail::rebind_wrap<A, node<A, T> >::type
            allocator;
        typedef typename ::boost::unordered::detail::allocator_traits<
          allocator>::pointer node_pointer;
        typedef node_pointer link_pointer;
        typedef typename ::boost::unordered::detail::rebind_wrap<A,
          bucket<node_pointer> >::type bucket_allocator;
        typedef typename ::boost::unordered::detail::allocator_traits<
          bucket_allocator>::pointer bucket_pointer;

        link_pointer next_;
        std::size_t bucket_info_;

        node() : next_(), bucket_info_(0) {}

        std::size_t get_bucket() const
        {
          return bucket_info_ & ((std::size_t)-1 >> 1);
        }

        std::size_t is_first_in_group() const
        {
          return !(bucket_info_ & ~((std::size_t)-1 >> 1));
        }

        void set_first_in_group()
        {
          bucket_info_ = bucket_info_ & ((std::size_t)-1 >> 1);
        }

        void reset_first_in_group()
        {
          bucket_info_ = bucket_info_ | ~((std::size_t)-1 >> 1);
        }

      private:
        node& operator=(node const&);
      };

      template <typename T>
      struct ptr_node : boost::unordered::detail::ptr_bucket
      {
        typedef T value_type;
        typedef boost::unordered::detail::ptr_bucket bucket_base;
        typedef ptr_node<T>* node_pointer;
        typedef ptr_bucket* link_pointer;
        typedef ptr_bucket* bucket_pointer;

        std::size_t bucket_info_;
        boost::unordered::detail::value_base<T> value_base_;

        ptr_node() : bucket_base(), bucket_info_(0) {}

        void* address() { return value_base_.address(); }
        value_type& value() { return value_base_.value(); }
        value_type* value_ptr() { return value_base_.value_ptr(); }

        std::size_t get_bucket() const
        {
          return bucket_info_ & ((std::size_t)-1 >> 1);
        }

        std::size_t is_first_in_group() const
        {
          return !(bucket_info_ & ~((std::size_t)-1 >> 1));
        }

        void set_first_in_group()
        {
          bucket_info_ = bucket_info_ & ((std::size_t)-1 >> 1);
        }

        void reset_first_in_group()
        {
          bucket_info_ = bucket_info_ | ~((std::size_t)-1 >> 1);
        }

      private:
        ptr_node& operator=(ptr_node const&);
      };

      // If the allocator uses raw pointers use ptr_node
      // Otherwise use node.

      template <typename A, typename T, typename NodePtr, typename BucketPtr>
      struct pick_node2
      {
        typedef boost::unordered::detail::node<A, T> node;

        typedef typename boost::unordered::detail::allocator_traits<
          typename boost::unordered::detail::rebind_wrap<A,
            node>::type>::pointer node_pointer;

        typedef boost::unordered::detail::bucket<node_pointer> bucket;
        typedef node_pointer link_pointer;
      };

      template <typename A, typename T>
      struct pick_node2<A, T, boost::unordered::detail::ptr_node<T>*,
        boost::unordered::detail::ptr_bucket*>
      {
        typedef boost::unordered::detail::ptr_node<T> node;
        typedef boost::unordered::detail::ptr_bucket bucket;
        typedef bucket* link_pointer;
      };

      template <typename A, typename T> struct pick_node
      {
        typedef typename boost::remove_const<T>::type nonconst;

        typedef boost::unordered::detail::allocator_traits<
          typename boost::unordered::detail::rebind_wrap<A,
            boost::unordered::detail::ptr_node<nonconst> >::type>
          tentative_node_traits;

        typedef boost::unordered::detail::allocator_traits<
          typename boost::unordered::detail::rebind_wrap<A,
            boost::unordered::detail::ptr_bucket>::type>
          tentative_bucket_traits;

        typedef pick_node2<A, nonconst, typename tentative_node_traits::pointer,
          typename tentative_bucket_traits::pointer>
          pick;

        typedef typename pick::node node;
        typedef typename pick::bucket bucket;
        typedef typename pick::link_pointer link_pointer;
      };
    }